

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void fmt::v6::internal::
     value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
     ::format_custom_arg<Query,fmt::v6::internal::fallback_formatter<Query,char,void>>
               (void *arg,
               basic_format_parse_context<char,_fmt::v6::internal::error_handler> *parse_ctx,
               basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
               *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  iterator pcVar3;
  iterator iVar4;
  fallback_formatter<Query,_char,_void> f;
  undefined8 local_60;
  undefined2 local_58;
  undefined4 local_56;
  undefined2 local_52;
  undefined4 local_50;
  undefined4 local_48;
  undefined4 local_38;
  undefined4 local_30;
  
  local_60 = 0xffffffff00000000;
  local_58 = 0;
  local_52 = 0;
  local_56 = 0x20;
  local_50 = 0;
  local_48 = 0;
  local_38 = 0;
  local_30 = 0;
  pcVar3 = formatter<fmt::v6::basic_string_view<char>,char,void>::
           parse<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>
                     ((formatter<fmt::v6::basic_string_view<char>,char,void> *)&local_60,parse_ctx);
  pcVar2 = (parse_ctx->format_str_).data_;
  (parse_ctx->format_str_).data_ = pcVar3;
  psVar1 = &(parse_ctx->format_str_).size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pcVar3));
  iVar4 = fallback_formatter<Query,char,void>::
          format<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                    ((fallback_formatter<Query,char,void> *)&local_60,(Query *)arg,ctx);
  (ctx->out_).container = iVar4.container;
  return;
}

Assistant:

static void format_custom_arg(
      const void* arg, basic_format_parse_context<char_type>& parse_ctx,
      Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }